

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_ppxstab_insert(jpc_ppxstab_t *tab,jpc_ppxstabent_t *ent)

{
  uint uVar1;
  jpc_ppxstabent_t **ppjVar2;
  ulong uVar3;
  ulong uVar4;
  size_t num_elements;
  
  uVar1 = tab->numents;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if (ent->ind < tab->ents[uVar4]->ind) goto LAB_0011e5f0;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
  }
LAB_0011e5f0:
  if (tab->maxents <= (int)uVar1) {
    num_elements = (long)tab->maxents + 0x80;
    if (tab->ents == (jpc_ppxstabent_t **)0x0) {
      ppjVar2 = (jpc_ppxstabent_t **)jas_alloc2(num_elements,8);
    }
    else {
      ppjVar2 = (jpc_ppxstabent_t **)jas_realloc2(tab->ents,num_elements,8);
    }
    if (ppjVar2 == (jpc_ppxstabent_t **)0x0) {
      return -1;
    }
    tab->ents = ppjVar2;
    tab->maxents = (int)num_elements;
  }
  uVar1 = tab->numents;
  uVar3 = (ulong)uVar1;
  if ((int)uVar4 < (int)uVar1) {
    uVar3 = (ulong)(int)uVar1;
    do {
      tab->ents[uVar3] = tab->ents[uVar3 - 1];
      uVar3 = uVar3 - 1;
    } while ((long)(int)uVar4 < (long)uVar3);
  }
  tab->ents[(int)uVar3] = ent;
  tab->numents = uVar1 + 1;
  return 0;
}

Assistant:

static int jpc_ppxstab_insert(jpc_ppxstab_t *tab, jpc_ppxstabent_t *ent)
{
	int inspt;
	int i;

	for (i = 0; i < tab->numents; ++i) {
		if (tab->ents[i]->ind > ent->ind) {
			break;
		}
	}
	inspt = i;

	if (tab->numents >= tab->maxents) {
		if (jpc_ppxstab_grow(tab, tab->maxents + 128)) {
			return -1;
		}
	}

	for (i = tab->numents; i > inspt; --i) {
		tab->ents[i] = tab->ents[i - 1];
	}
	tab->ents[i] = ent;
	++tab->numents;

	return 0;
}